

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAndroidExtensionPackES31ATests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ExtensionPackTestCase::init
          (ExtensionPackTestCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ContextInfo *this_00;
  undefined7 extraout_var;
  NotSupportedError *this_01;
  allocator<char> local_31;
  string local_30;
  ExtensionPackTestCase *local_10;
  ExtensionPackTestCase *this_local;
  
  local_10 = this;
  this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ANDROID_extension_pack_es31a");
  if (!bVar1) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Test requires GL_ANDROID_extension_pack_es31a extension",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_30);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void ExtensionPackTestCase::init (void)
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ANDROID_extension_pack_es31a"))
		throw tcu::NotSupportedError("Test requires GL_ANDROID_extension_pack_es31a extension");
}